

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O0

pair<int,_void_*> __thiscall
uWS::HttpParser::fenceAndConsumePostPadded<1>
          (HttpParser *this,char *data,int length,void *user,HttpRequest *req,
          unique_function<void_*(void_*,_HttpRequest_*)> *requestHandler,
          unique_function<void_*(void_*,_std::string_view,_bool)> *dataHandler)

{
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  string_view key;
  string_view lowerCasedHeader;
  uint uVar1;
  HttpRequest *this_00;
  size_type sVar2;
  int *piVar3;
  const_pointer pvVar4;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  void *in_RCX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  pair<int,_void_*> pVar5;
  string_view contentLengthString;
  void *returnedUser;
  char *querySeparatorPtr;
  Header *h;
  int consumed;
  int consumedTotal;
  HttpRequest *in_stack_fffffffffffffef0;
  void *in_stack_fffffffffffffef8;
  const_pointer in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *pbVar6;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 uVar7;
  BloomFilter *in_stack_ffffffffffffff40;
  Header *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string_view local_98;
  void *local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  size_t local_78;
  char *local_70;
  basic_string_view<char,_std::char_traits<char>_> *local_68;
  int local_60 [2];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  uint local_48;
  int local_44 [3];
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  undefined8 local_30;
  int local_24;
  long local_20;
  pair<int,_void_*> local_10;
  
  local_44[0] = 0;
  *(undefined1 *)(in_RSI + in_EDX) = 0xd;
  uVar7 = false;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  if (in_EDX != 0) {
    local_48 = getHeaders(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    uVar7 = local_48 != 0;
  }
  if ((bool)uVar7 != false) {
    local_20 = local_20 + (int)local_48;
    local_24 = local_24 - local_48;
    local_44[0] = local_48 + local_44[0];
    this_00 = (HttpRequest *)
              std::basic_string_view<char,_std::char_traits<char>_>::data(local_38 + 1);
    local_60[1] = 0;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_38 + 1);
    local_60[0] = (int)sVar2 + -9;
    piVar3 = std::max<int>(local_60 + 1,local_60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,(char *)this_00,(long)*piVar3);
    local_38[1]._M_len = local_58._M_len;
    local_38[1]._M_str = local_58._M_str;
    local_68 = local_38;
    while( true ) {
      local_68 = local_68 + 2;
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_68);
      if (sVar2 == 0) break;
      local_78 = local_68->_M_len;
      local_70 = local_68->_M_str;
      key._M_len._7_1_ = uVar7;
      key._M_len._0_7_ = in_stack_ffffffffffffff28;
      key._M_str = in_RDI;
      BloomFilter::add((BloomFilter *)this_00,key);
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_38 + 1);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_38 + 1);
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)memchr(pvVar4,0x3f,sVar2);
    local_80 = this_01;
    if (this_01 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      in_stack_ffffffffffffff08 =
           std::basic_string_view<char,_std::char_traits<char>_>::data(local_38 + 1);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_38 + 1);
      this_01 = (basic_string_view<char,_std::char_traits<char>_> *)
                (in_stack_ffffffffffffff08 + sVar2);
    }
    pbVar6 = this_01;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_38 + 1);
    *(int *)&local_38[100]._M_len = (int)this_01 - (int)pvVar4;
    local_88 = fu2::abi_400::detail::type_erasure::invocation_table::
               operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_uWS::HttpRequest_*)>_>,_void_*(void_*,_uWS::HttpRequest_*)>
               ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_uWS::HttpRequest_*)>_>,_void_*(void_*,_uWS::HttpRequest_*)>
                             *)this_01,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    if (local_88 != local_30) {
      std::pair<int,_void_*>::pair<int_&,_void_*&,_true>(&local_10,local_44,&local_88);
      goto LAB_002402ed;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,(char *)local_38);
    lowerCasedHeader._M_len._7_1_ = uVar7;
    lowerCasedHeader._M_len._0_7_ = in_stack_ffffffffffffff28;
    lowerCasedHeader._M_str = in_RDI;
    local_98 = HttpRequest::getHeader(this_00,lowerCasedHeader);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_98);
    if (sVar2 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff38);
      args_1._M_str = (char *)pbVar6;
      args_1._M_len = (size_t)in_stack_ffffffffffffff08;
      fu2::abi_400::detail::type_erasure::invocation_table::
      operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
      ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>,_void_*(void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                    *)this_01,local_38,args_1,(bool)local_30._7_1_);
    }
    else {
      str._M_str = (char *)pbVar6;
      str._M_len = (size_t)in_stack_ffffffffffffff08;
      uVar1 = toUnsignedInteger(str);
      *(uint *)(in_RDI + 0x20) = uVar1;
    }
  }
  std::pair<int,_void_*>::pair<int_&,_void_*&,_true>(&local_10,local_44,(void **)&local_30);
LAB_002402ed:
  pVar5._4_4_ = 0;
  pVar5.first = local_10.first;
  pVar5.second = local_10.second;
  return pVar5;
}

Assistant:

std::pair<int, void *> fenceAndConsumePostPadded(char *data, int length, void *user, HttpRequest *req, fu2::unique_function<void *(void *, HttpRequest *)> &requestHandler, fu2::unique_function<void *(void *, std::string_view, bool)> &dataHandler) {
        int consumedTotal = 0;
        data[length] = '\r';

        for (int consumed; length && (consumed = getHeaders(data, data + length, req->headers, &req->bf)); ) {
            data += consumed;
            length -= consumed;
            consumedTotal += consumed;

            /* Strip away tail of first "header value" aka URL */
            req->headers->value = std::string_view(req->headers->value.data(), std::max<int>(0, (int) req->headers->value.length() - 9));

            /* Add all headers to bloom filter */
            for (HttpRequest::Header *h = req->headers; (++h)->key.length(); ) {
                req->bf.add(h->key);
            }

            /* Parse query */
            const char *querySeparatorPtr = (const char *) memchr(req->headers->value.data(), '?', req->headers->value.length());
            req->querySeparator = (int) ((querySeparatorPtr ? querySeparatorPtr : req->headers->value.data() + req->headers->value.length()) - req->headers->value.data());

            /* If returned socket is not what we put in we need
             * to break here as we either have upgraded to
             * WebSockets or otherwise closed the socket. */
            void *returnedUser = requestHandler(user, req);
            if (returnedUser != user) {
                /* We are upgraded to WebSocket or otherwise broken */
                return {consumedTotal, returnedUser};
            }

            // todo: do not check this for GET (get should not have a body)
            // todo: also support reading chunked streams
            std::string_view contentLengthString = req->getHeader("content-length");
            if (contentLengthString.length()) {
                remainingStreamingBytes = toUnsignedInteger(contentLengthString);

                if (!CONSUME_MINIMALLY) {
                    unsigned int emittable = std::min<unsigned int>(remainingStreamingBytes, length);
                    dataHandler(user, std::string_view(data, emittable), emittable == remainingStreamingBytes);
                    remainingStreamingBytes -= emittable;

                    data += emittable;
                    length -= emittable;
                    consumedTotal += emittable;
                }
            } else {
                /* Still emit an empty data chunk to signal no data */
                dataHandler(user, {}, true);
            }

            if (CONSUME_MINIMALLY) {
                break;
            }
        }
        return {consumedTotal, user};
    }